

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_draft6.hpp
# Opt level: O0

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
jsoncons::jsonschema::draft6::
schema_draft6<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::get_schema(void)

{
  int iVar1;
  undefined8 extraout_RDX;
  basic_json_options<char> *in_RDI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> bVar2;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffe88;
  basic_json_options<char> *this;
  basic_json_decode_options<char> *in_stack_fffffffffffffea0;
  char_type *in_stack_fffffffffffffea8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> local_150 [21];
  
  this = in_RDI;
  if (schema_draft6<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
      ::get_schema()::sch == '\0') {
    iVar1 = __cxa_guard_acquire(&schema_draft6<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                                 ::get_schema()::sch);
    if (iVar1 != 0) {
      in_stack_fffffffffffffe88 = local_150;
      memset(in_stack_fffffffffffffe88,0,0x148);
      basic_json_options<char>::basic_json_options
                ((basic_json_options<char> *)in_stack_fffffffffffffea0);
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::parse
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      basic_json_options<char>::~basic_json_options(this);
      __cxa_atexit(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                   ~basic_json,&get_schema::sch,&__dso_handle);
      __cxa_guard_release(&schema_draft6<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           ::get_schema()::sch);
    }
  }
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             in_stack_fffffffffffffe88);
  bVar2.field_0.int64_.val_ = extraout_RDX;
  bVar2.field_0._0_8_ = in_RDI;
  return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>)bVar2.field_0;
}

Assistant:

static Json get_schema() 
        {
            static Json sch = Json::parse(R"(
{
    "$schema": "http://json-schema.org/draft-06/schema#",
    "$id": "http://json-schema.org/draft-06/schema#",
    "title": "Core schema meta-schema",
    "definitions": {
        "schemaArray": {
            "type": "array",
            "minItems": 1,
            "items": { "$ref": "#" }
        },
        "nonNegativeInteger": {
            "type": "integer",
            "minimum": 0
        },
        "nonNegativeIntegerDefault0": {
            "allOf": [
                { "$ref": "#/definitions/nonNegativeInteger" },
                { "default": 0 }
            ]
        },
        "simpleTypes": {
            "enum": [
                "array",
                "boolean",
                "integer",
                "null",
                "number",
                "object",
                "string"
            ]
        },
        "stringArray": {
            "type": "array",
            "items": { "type": "string" },
            "uniqueItems": true,
            "default": []
        }
    },
    "type": ["object", "boolean"],
    "properties": {
        "$id": {
            "type": "string",
            "format": "uri-reference"
        },
        "$schema": {
            "type": "string",
            "format": "uri"
        },
        "$ref": {
            "type": "string",
            "format": "uri-reference"
        },
        "title": {
            "type": "string"
        },
        "description": {
            "type": "string"
        },
        "default": {},
        "examples": {
            "type": "array",
            "items": {}
        },
        "multipleOf": {
            "type": "number",
            "exclusiveMinimum": 0
        },
        "maximum": {
            "type": "number"
        },
        "exclusiveMaximum": {
            "type": "number"
        },
        "minimum": {
            "type": "number"
        },
        "exclusiveMinimum": {
            "type": "number"
        },
        "maxLength": { "$ref": "#/definitions/nonNegativeInteger" },
        "minLength": { "$ref": "#/definitions/nonNegativeIntegerDefault0" },
        "pattern": {
            "type": "string",
            "format": "regex"
        },
        "additionalItems": { "$ref": "#" },
        "items": {
            "anyOf": [
                { "$ref": "#" },
                { "$ref": "#/definitions/schemaArray" }
            ],
            "default": {}
        },
        "maxItems": { "$ref": "#/definitions/nonNegativeInteger" },
        "minItems": { "$ref": "#/definitions/nonNegativeIntegerDefault0" },
        "uniqueItems": {
            "type": "boolean",
            "default": false
        },
        "contains": { "$ref": "#" },
        "maxProperties": { "$ref": "#/definitions/nonNegativeInteger" },
        "minProperties": { "$ref": "#/definitions/nonNegativeIntegerDefault0" },
        "required": { "$ref": "#/definitions/stringArray" },
        "additionalProperties": { "$ref": "#" },
        "definitions": {
            "type": "object",
            "additionalProperties": { "$ref": "#" },
            "default": {}
        },
        "properties": {
            "type": "object",
            "additionalProperties": { "$ref": "#" },
            "default": {}
        },
        "patternProperties": {
            "type": "object",
            "additionalProperties": { "$ref": "#" },
            "propertyNames": { "format": "regex" },
            "default": {}
        },
        "dependencies": {
            "type": "object",
            "additionalProperties": {
                "anyOf": [
                    { "$ref": "#" },
                    { "$ref": "#/definitions/stringArray" }
                ]
            }
        },
        "propertyNames": { "$ref": "#" },
        "const": {},
        "enum": {
            "type": "array"
        },
        "type": {
            "anyOf": [
                { "$ref": "#/definitions/simpleTypes" },
                {
                    "type": "array",
                    "items": { "$ref": "#/definitions/simpleTypes" },
                    "minItems": 1,
                    "uniqueItems": true
                }
            ]
        },
        "format": { "type": "string" },
        "allOf": { "$ref": "#/definitions/schemaArray" },
        "anyOf": { "$ref": "#/definitions/schemaArray" },
        "oneOf": { "$ref": "#/definitions/schemaArray" },
        "not": { "$ref": "#" }
    },
    "default": {}
}
            )"); 

            return sch;
        }